

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::numVerticesPerPrimitive(TessPrimitiveType primitiveType,bool usePointMode)

{
  int iStack_c;
  bool usePointMode_local;
  TessPrimitiveType primitiveType_local;
  
  if (usePointMode) {
    iStack_c = 1;
  }
  else if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    iStack_c = 3;
  }
  else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
    iStack_c = 3;
  }
  else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    iStack_c = 2;
  }
  else {
    iStack_c = 0;
  }
  return iStack_c;
}

Assistant:

int numVerticesPerPrimitive (const TessPrimitiveType primitiveType, const bool usePointMode)
{
	if (usePointMode)
		return 1;

	switch (primitiveType)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:	return 3;
		case TESSPRIMITIVETYPE_QUADS:		return 3;  // quads are composed of two triangles
		case TESSPRIMITIVETYPE_ISOLINES:	return 2;
		default:
			DE_ASSERT(false);
			return 0;
	}
}